

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

ostream * maths::operator<<(ostream *os,Matrix *m)

{
  int j;
  long lVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < m->rows_; lVar2 = lVar2 + 1) {
    std::ostream::_M_insert<double>(*m->p[lVar2]);
    for (lVar1 = 1; lVar1 < m->cols_; lVar1 = lVar1 + 1) {
      std::operator<<(os," ");
      std::ostream::_M_insert<double>(m->p[lVar2][lVar1]);
    }
    std::endl<char,std::char_traits<char>>(os);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Matrix& m)
{
    for (int i = 0; i < m.rows_; ++i) {
        os << m.p[i][0];
        for (int j = 1; j < m.cols_; ++j) {
            os << " " << m.p[i][j];
        }
        os << endl;
    }
    return os;
}